

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O2

bool __thiscall HighsCutGeneration::determineCover(HighsCutGeneration *this,bool lpSol)

{
  HighsCDouble *this_00;
  int iVar1;
  pointer piVar2;
  int *piVar3;
  pointer pdVar4;
  pointer pdVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  anon_class_24_3_1824b316 comp;
  int iVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  vector<int,_std::allocator<int>_> *this_01;
  ulong uVar15;
  long lVar16;
  HighsCDouble *v;
  double dVar17;
  anon_class_16_2_fd512ddf comp_00;
  HighsCDouble HVar18;
  undefined1 in_stack_ffffffffffffff68;
  HighsInt r;
  HighsCDouble *local_78;
  undefined8 uStack_70;
  ulong local_60;
  vector<int,_std::allocator<int>_> *local_58;
  ulong local_50;
  HighsCutGeneration *local_48;
  long lStack_40;
  HighsInt *local_38;
  
  if ((this->rhs).hi + (this->rhs).lo <= this->feastol * 10.0) {
    return false;
  }
  this_01 = &this->cover;
  piVar2 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  std::vector<int,_std::allocator<int>_>::reserve(this_01,(long)this->rowlen);
  iVar6 = 0;
  while( true ) {
    local_48 = (HighsCutGeneration *)CONCAT44(local_48._4_4_,iVar6);
    if (iVar6 == this->rowlen) break;
    if (((this->isintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start[iVar6] != '\0') &&
       ((!lpSol ||
        (this->feastol <
         (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[iVar6])))) {
      std::vector<int,_std::allocator<int>_>::push_back(this_01,(value_type_conflict2 *)&local_48);
      iVar6 = (int)local_48;
    }
    iVar6 = iVar6 + 1;
  }
  uVar15 = (long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  uVar12 = uVar15 >> 2;
  local_78 = &this->rhs;
  r = HighsRandom::integer(&this->randgen);
  this_00 = &this->coverweight;
  (this->coverweight).hi = 0.0;
  (this->coverweight).lo = 0.0;
  local_50 = uVar12;
  if (lpSol) {
    piVar3 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar7 = piVar3;
    do {
      pdVar4 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      while( true ) {
        piVar9 = piVar8;
        if (piVar7 == piVar8) goto LAB_0028fece;
        iVar6 = *piVar7;
        if (pdVar5[iVar6] < pdVar4[iVar6] - this->feastol) break;
        piVar7 = piVar7 + 1;
      }
      do {
        piVar8 = piVar8 + -1;
        piVar9 = piVar7;
        if (piVar8 == piVar7) goto LAB_0028fece;
        iVar1 = *piVar8;
      } while (pdVar5[iVar1] < pdVar4[iVar1] - this->feastol);
      *piVar7 = iVar1;
      *piVar8 = iVar6;
      piVar7 = piVar7 + 1;
    } while( true );
  }
  begin._M_current =
       (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  lStack_40 = (long)(this->lpRelaxation->mipsolver->mipdata_)._M_t.
                    super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                    .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x67f0;
  lVar10 = uVar15 * 0x40000000;
  local_38 = &r;
  local_48 = this;
  if (lVar10 != 0) {
    iVar6 = pdqsort_detail::log2<long>(lVar10 >> 0x20);
    comp.nodequeue = (HighsNodeQueue *)lStack_40;
    comp.this = local_48;
    comp.r = local_38;
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2,false>
              (begin,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     ((lVar10 >> 0x1e) + begin._M_current),comp,iVar6,true);
  }
  iVar6 = 0;
  v = local_78;
LAB_0028ff66:
  dVar17 = this->feastol * 10.0;
  local_78 = (HighsCDouble *)(ABS((this->rhs).hi + (this->rhs).lo) * this->feastol);
  if ((double)local_78 <= dVar17) {
    local_78 = (HighsCDouble *)dVar17;
  }
  uStack_70 = 0;
  uVar15 = (ulong)iVar6;
  uVar12 = (ulong)(int)local_50;
  while ((uVar13 = local_50, uVar12 != uVar15 &&
         (HVar18 = HighsCDouble::operator-(this_00,v), uVar13 = uVar15,
         HVar18.lo + HVar18.hi <= (double)local_78))) {
    iVar6 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15];
    HighsCDouble::operator+=
              (this_00,this->vals[iVar6] *
                       (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar6]);
    uVar15 = uVar15 + 1;
  }
  if ((int)uVar13 != 0) {
    HighsCDouble::renormalize(this_00);
    HVar18 = HighsCDouble::operator-(this_00,v);
    this->lambda = HVar18;
    if ((double)local_78 < HVar18.hi + HVar18.lo) {
      std::vector<int,_std::allocator<int>_>::resize(this_01,(long)(int)uVar13);
      return true;
    }
  }
  return false;
LAB_0028fece:
  uVar12 = (long)piVar9 - (long)piVar3;
  local_60 = uVar12 >> 2;
  uVar14 = local_60 & 0xffffffff;
  local_58 = this_01;
  for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
    iVar6 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar13];
    HighsCDouble::operator+=
              (this_00,this->vals[iVar6] *
                       (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar6]);
  }
  lVar10 = (long)(uVar12 * 0x40000000) >> 0x1e;
  lVar16 = (long)(uVar15 * 0x40000000) >> 0x1e;
  lVar11 = lVar16 - lVar10;
  if (lVar11 != 0) {
    piVar2 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar6 = pdqsort_detail::log2<long>(lVar11 >> 2);
    comp_00.r._0_4_ = iVar6;
    comp_00.this = (HighsCutGeneration *)&r;
    comp_00.r._4_4_ = 0;
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1,false>
              ((pdqsort_detail *)(lVar10 + (long)piVar2),(int *)(lVar16 + (long)piVar2),
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,comp_00,1,
               (bool)in_stack_ffffffffffffff68);
  }
  iVar6 = (int)local_60;
  this_01 = local_58;
  v = local_78;
  goto LAB_0028ff66;
}

Assistant:

bool HighsCutGeneration::determineCover(bool lpSol) {
  if (rhs <= 10 * feastol) return false;

  cover.clear();
  cover.reserve(rowlen);

  for (HighsInt j = 0; j != rowlen; ++j) {
    if (!isintegral[j]) continue;

    if (lpSol && solval[j] <= feastol) continue;

    cover.push_back(j);
  }

  HighsInt maxCoverSize = cover.size();
  HighsInt coversize = 0;
  HighsInt r = randgen.integer();
  coverweight = 0.0;
  if (lpSol) {
    // take all variables that sit at their upper bound always into the cover
    coversize = std::partition(cover.begin(), cover.end(),
                               [&](HighsInt j) {
                                 return solval[j] >= upper[j] - feastol;
                               }) -
                cover.begin();

    for (HighsInt i = 0; i != coversize; ++i) {
      HighsInt j = cover[i];

      assert(solval[j] >= upper[j] - feastol);

      coverweight += vals[j] * upper[j];
    }

    // sort the remaining variables by the contribution to the rows activity in
    // the current solution
    pdqsort(cover.begin() + coversize, cover.begin() + maxCoverSize,
            [&](HighsInt i, HighsInt j) {
              if (upper[i] < 1.5 && upper[j] > 1.5) return true;
              if (upper[i] > 1.5 && upper[j] < 1.5) return false;

              double contributionA = solval[i] * vals[i];
              double contributionB = solval[j] * vals[j];

              if (contributionA > contributionB + feastol) return true;
              if (contributionA < contributionB - feastol) return false;
              // for equal contributions take the larger coefficients first
              // because this makes some of the lifting functions more likely
              // to generate a facet
              // if the value is equal too, choose a random tiebreaker based
              // on hashing the column index and the current number of pool
              // cuts
              if (std::abs(vals[i] - vals[j]) <= feastol)
                return HighsHashHelpers::hash(std::make_pair(inds[i], r)) >
                       HighsHashHelpers::hash(std::make_pair(inds[j], r));
              return vals[i] > vals[j];
            });
  } else {
    // the current solution
    const auto& nodequeue = lpRelaxation.getMipSolver().mipdata_->nodequeue;

    pdqsort(cover.begin() + coversize, cover.begin() + maxCoverSize,
            [&](HighsInt i, HighsInt j) {
              if (solval[i] > feastol && solval[j] <= feastol) return true;
              if (solval[i] <= feastol && solval[j] > feastol) return false;

              int64_t numNodesA;
              int64_t numNodesB;

              numNodesA = complementation[i] ? nodequeue.numNodesDown(inds[i])
                                             : nodequeue.numNodesUp(inds[i]);

              numNodesB = complementation[j] ? nodequeue.numNodesDown(inds[j])
                                             : nodequeue.numNodesUp(inds[j]);

              if (numNodesA > numNodesB) return true;
              if (numNodesA < numNodesB) return false;

              return HighsHashHelpers::hash(std::make_pair(inds[i], r)) >
                     HighsHashHelpers::hash(std::make_pair(inds[j], r));
            });
  }

  const double minlambda =
      std::max(10 * feastol, feastol * std::abs(double(rhs)));

  for (; coversize != maxCoverSize; ++coversize) {
    double lambda = double(coverweight - rhs);
    if (lambda > minlambda) break;

    HighsInt j = cover[coversize];
    coverweight += vals[j] * upper[j];
  }
  if (coversize == 0) return false;

  coverweight.renormalize();
  lambda = coverweight - rhs;

  if (lambda <= minlambda) return false;

  cover.resize(coversize);
  assert(lambda > feastol);

  return true;
}